

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O2

ON_SubDVertex * __thiscall
ON_SubD_FixedSizeHeap::FindOrAllocateVertex(ON_SubD_FixedSizeHeap *this,ON_SubDEdge *edge0)

{
  uint hash;
  ON_SubDComponentPtr component0;
  ON_SubDVertex *pOVar1;
  
  if (edge0 != (ON_SubDEdge *)0x0) {
    component0 = ON_SubDComponentPtr::Create(edge0);
    hash = Internal_Hash(this,component0);
    pOVar1 = Internal_HashFindVertex1(this,hash,component0);
    if (pOVar1 != (ON_SubDVertex *)0x0) {
      if (3 < pOVar1->m_edge_capacity) {
        return pOVar1;
      }
      ON_SubDIncrementErrorCount();
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_heap.cpp"
                 ,0x20d,"","edge capacity was too small when vertex was created.");
      return pOVar1;
    }
    pOVar1 = AllocateVertex(this,edge0);
    if (pOVar1 != (ON_SubDVertex *)0x0) {
      Internal_HashAddPair(this,hash,component0,pOVar1);
      return pOVar1;
    }
  }
  ON_SubDIncrementErrorCount();
  return (ON_SubDVertex *)0x0;
}

Assistant:

ON_SubDVertex * ON_SubD_FixedSizeHeap::FindOrAllocateVertex(const ON_SubDEdge * edge0)
{
  if ( nullptr == edge0)
    return ON_SUBD_RETURN_ERROR(nullptr);

  const ON_SubDComponentPtr component0 = ON_SubDComponentPtr::Create(edge0);
  const unsigned int hash = Internal_Hash(component0);
  ON_SubDVertex* v1 = Internal_HashFindVertex1(hash, component0);

  if (nullptr != v1)
  {
    // found the previously allocated vertex
    if (((unsigned int)v1->m_edge_capacity) < 4)
    {
      ON_SUBD_ERROR("edge capacity was too small when vertex was created.");
    }
    return v1;
  }

  v1 = AllocateVertex(edge0);
  if (nullptr == v1)
    return ON_SUBD_RETURN_ERROR(nullptr);
  Internal_HashAddPair(hash, component0, v1);

  return v1;
}